

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RingDecomposerLib.c
# Opt level: O0

uint RDL_getFamiliesContainingNode_internal(RDL_data *data,RDL_node object,uint **ptr,char family)

{
  uint *puVar1;
  uint local_30;
  uint i;
  char family_local;
  uint **ptr_local;
  RDL_node object_local;
  RDL_data *data_local;
  
  if (data == (RDL_data *)0x0) {
    (*RDL_outputFunc)(RDL_ERROR,"RDL_data is NULL!\n");
    puVar1 = (uint *)malloc(4);
    *ptr = puVar1;
    data_local._4_4_ = 0xffffffff;
  }
  else if (object < data->graph->V) {
    if (data->nofURFs == 0) {
      puVar1 = (uint *)malloc(4);
      *ptr = puVar1;
      data_local._4_4_ = 0;
    }
    else {
      puVar1 = RDL_listFamilies(data,object,'a',family);
      *ptr = puVar1;
      for (local_30 = 0; (*ptr)[local_30] != 0xffffffff; local_30 = local_30 + 1) {
      }
      data_local._4_4_ = local_30;
    }
  }
  else {
    (*RDL_outputFunc)(RDL_ERROR,"invalid node: %u\n",(ulong)object);
    puVar1 = (uint *)malloc(4);
    *ptr = puVar1;
    data_local._4_4_ = 0xffffffff;
  }
  return data_local._4_4_;
}

Assistant:

static unsigned RDL_getFamiliesContainingNode_internal(
    const RDL_data *data, RDL_node object, unsigned **ptr,
    char family)
{
  unsigned i;

  if (!data) {
    RDL_outputFunc(RDL_ERROR, "RDL_data is NULL!\n");
    (*ptr) = malloc(sizeof(**ptr));
    return RDL_INVALID_RESULT;
  }

  if (object >= data->graph->V) {
    RDL_outputFunc(RDL_ERROR, "invalid node: %u\n", object);
    (*ptr) = malloc(sizeof(**ptr));
    return RDL_INVALID_RESULT;
  }

  if (data->nofURFs < 1) {
    (*ptr) = malloc(sizeof(**ptr));
    return 0;
  }

  *ptr = RDL_listFamilies(data, object, 'a', family);
  for(i=0; (*ptr)[i]<UINT_MAX; ++i);
  return i;
}